

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  Config *pCVar1;
  type tVar2;
  unsigned_long *puVar3;
  exception *ex;
  int local_68;
  uint local_3c;
  undefined1 local_38 [8];
  Option<unsigned_long> listed;
  Session *this_local;
  
  if (((this->m_configData).showHelp & 1U) == 0) {
    config(this);
    pCVar1 = Ptr<Catch::Config>::operator*(&this->m_config);
    seedRng((IConfig *)pCVar1);
    if (((this->m_configData).filenamesAsTags & 1U) != 0) {
      pCVar1 = Ptr<Catch::Config>::operator*(&this->m_config);
      applyFilenamesAsTags((IConfig *)pCVar1);
    }
    pCVar1 = config(this);
    list((Catch *)local_38,pCVar1);
    tVar2 = Option::operator_cast_to_function_pointer((Option *)local_38);
    if (tVar2 != 0) {
      puVar3 = Option<unsigned_long>::operator*((Option<unsigned_long> *)local_38);
      this_local._4_4_ = (int)*puVar3;
    }
    local_3c = (uint)(tVar2 != 0);
    Option<unsigned_long>::~Option((Option<unsigned_long> *)local_38);
    if (local_3c == 0) {
      runTests((Totals *)&ex,&this->m_config);
      this_local._4_4_ = local_68;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int run() {
			if (m_configData.showHelp)
				return 0;

			try
			{
				config(); // Force config to be constructed

				seedRng(*m_config);

				if (m_configData.filenamesAsTags)
					applyFilenamesAsTags(*m_config);

				// Handle list request
				if (Option<std::size_t> listed = list(config()))
					return static_cast<int>(*listed);

				return static_cast<int>(runTests(m_config).assertions.failed);
			}
			catch (std::exception& ex) {
				Catch::cerr() << ex.what() << std::endl;
				return (std::numeric_limits<int>::max)();
			}
		}